

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

UINT16 TPMS_CLOCK_INFO_Marshal(TPMS_CLOCK_INFO *source,BYTE **buffer,INT32 *size)

{
  UINT64_Marshal(&source->clock,buffer,size);
  UINT32_Marshal(&source->resetCount,buffer,size);
  UINT32_Marshal(&source->restartCount,buffer,size);
  UINT8_Marshal(&source->safe,buffer,size);
  return 0x11;
}

Assistant:

UINT16
TPMS_CLOCK_INFO_Marshal(TPMS_CLOCK_INFO *source, BYTE **buffer, INT32 *size)
{
    UINT16    result = 0;
    result = (UINT16)(result + UINT64_Marshal((UINT64 *)&(source->clock), buffer, size));
    result = (UINT16)(result + UINT32_Marshal((UINT32 *)&(source->resetCount), buffer, size));
    result = (UINT16)(result + UINT32_Marshal((UINT32 *)&(source->restartCount), buffer, size));
    result = (UINT16)(result + TPMI_YES_NO_Marshal((TPMI_YES_NO *)&(source->safe), buffer, size));
    return result;
}